

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void SetActorRoll(AActor *activator,int tid,int angle,bool interpolate)

{
  AActor *this;
  TAngle<double> local_50;
  AActor *local_48;
  AActor *actor;
  FActorIterator iterator;
  TAngle<double> local_28;
  DAngle an;
  bool interpolate_local;
  int angle_local;
  int tid_local;
  AActor *activator_local;
  
  an.Degrees._7_1_ = interpolate;
  ACSToAngle((int)&local_28);
  if (tid == 0) {
    if (activator != (AActor *)0x0) {
      TAngle<double>::TAngle((TAngle<double> *)&iterator.id,&local_28);
      AActor::SetRoll(activator,(DAngle *)&iterator.id,(bool)(an.Degrees._7_1_ & 1));
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)&actor,tid);
    while (this = FActorIterator::Next((FActorIterator *)&actor), this != (AActor *)0x0) {
      local_48 = this;
      TAngle<double>::TAngle(&local_50,&local_28);
      AActor::SetRoll(this,&local_50,(bool)(an.Degrees._7_1_ & 1));
    }
  }
  return;
}

Assistant:

static void SetActorRoll(AActor *activator, int tid, int angle, bool interpolate)
{
	DAngle an = ACSToAngle(angle);
	if (tid == 0)
	{
		if (activator != NULL)
		{
			activator->SetRoll(an, interpolate);
		}
	}
	else
	{
		FActorIterator iterator(tid);
		AActor *actor;

		while ((actor = iterator.Next()))
		{
			actor->SetRoll(an, interpolate);
		}
	}
}